

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O0

int secp256k1_rangeproof_genrand
              (secp256k1_scalar *sec,secp256k1_scalar *s,uchar *message,size_t *rsizes,size_t rings,
              uchar *nonce,secp256k1_ge *commit,uchar *proof,size_t len,secp256k1_ge *genp)

{
  int iVar1;
  secp256k1_scalar *psVar2;
  bool bVar3;
  bool local_15a;
  long local_158;
  size_t npub;
  ulong uStack_148;
  int b;
  size_t j;
  size_t i;
  int ret;
  int overflow;
  secp256k1_scalar acc;
  secp256k1_rfc6979_hmac_sha256 rng;
  uchar rngseed [108];
  uchar tmp [32];
  uchar *nonce_local;
  size_t rings_local;
  size_t *rsizes_local;
  uchar *message_local;
  secp256k1_scalar *s_local;
  secp256k1_scalar *sec_local;
  
  rng._60_8_ = *(undefined8 *)nonce;
  rngseed._0_8_ = *(undefined8 *)(nonce + 8);
  rngseed._8_8_ = *(undefined8 *)(nonce + 0x10);
  rngseed._16_8_ = *(undefined8 *)(nonce + 0x18);
  secp256k1_rangeproof_serialize_point(rngseed + 0x18,commit);
  secp256k1_rangeproof_serialize_point(rngseed + 0x39,genp);
  memcpy(rngseed + 0x5a,proof,len);
  secp256k1_rfc6979_hmac_sha256_initialize
            ((secp256k1_rfc6979_hmac_sha256 *)((long)acc.d + 0x1c),rng.k + 0x1c,len + 0x62);
  secp256k1_scalar_clear((secp256k1_scalar *)&ret);
  local_158 = 0;
  i._0_4_ = 1;
  for (j = 0; j < rings; j = j + 1) {
    if (j < rings - 1) {
      secp256k1_rfc6979_hmac_sha256_generate
                ((secp256k1_rfc6979_hmac_sha256 *)((long)acc.d + 0x1c),rngseed + 0x68,0x20);
      do {
        secp256k1_rfc6979_hmac_sha256_generate
                  ((secp256k1_rfc6979_hmac_sha256 *)((long)acc.d + 0x1c),rngseed + 0x68,0x20);
        secp256k1_scalar_set_b32(sec + j,rngseed + 0x68,(int *)((long)&i + 4));
        bVar3 = true;
        if (i._4_4_ == 0) {
          iVar1 = secp256k1_scalar_is_zero(sec + j);
          bVar3 = iVar1 != 0;
        }
      } while (bVar3);
      secp256k1_scalar_add((secp256k1_scalar *)&ret,(secp256k1_scalar *)&ret,sec + j);
    }
    else {
      secp256k1_scalar_negate((secp256k1_scalar *)&ret,(secp256k1_scalar *)&ret);
      psVar2 = sec + j;
      psVar2->d[0] = _ret;
      psVar2->d[1] = acc.d[0];
      psVar2->d[2] = acc.d[1];
      psVar2->d[3] = acc.d[2];
    }
    for (uStack_148 = 0; uStack_148 < rsizes[j]; uStack_148 = uStack_148 + 1) {
      secp256k1_rfc6979_hmac_sha256_generate
                ((secp256k1_rfc6979_hmac_sha256 *)((long)acc.d + 0x1c),rngseed + 0x68,0x20);
      if (message != (uchar *)0x0) {
        for (npub._4_4_ = 0; npub._4_4_ < 0x20; npub._4_4_ = npub._4_4_ + 1) {
          rngseed[(long)npub._4_4_ + 0x68] =
               rngseed[(long)npub._4_4_ + 0x68] ^
               message[(j * 4 + uStack_148) * 0x20 + (long)npub._4_4_];
          message[(j * 4 + uStack_148) * 0x20 + (long)npub._4_4_] = rngseed[(long)npub._4_4_ + 0x68]
          ;
        }
      }
      secp256k1_scalar_set_b32(s + local_158,rngseed + 0x68,(int *)((long)&i + 4));
      local_15a = true;
      if (i._4_4_ == 0) {
        iVar1 = secp256k1_scalar_is_zero(s + local_158);
        local_15a = iVar1 != 0;
      }
      i._0_4_ = ((local_15a ^ 0xffU) & 1) & (uint)i;
      local_158 = local_158 + 1;
    }
  }
  secp256k1_rfc6979_hmac_sha256_finalize((secp256k1_rfc6979_hmac_sha256 *)((long)acc.d + 0x1c));
  secp256k1_scalar_clear((secp256k1_scalar *)&ret);
  memset(rngseed + 0x68,0,0x20);
  return (uint)i;
}

Assistant:

SECP256K1_INLINE static int secp256k1_rangeproof_genrand(secp256k1_scalar *sec, secp256k1_scalar *s, unsigned char *message,
 size_t *rsizes, size_t rings, const unsigned char *nonce, const secp256k1_ge *commit, const unsigned char *proof, size_t len, const secp256k1_ge* genp) {
    unsigned char tmp[32];
    unsigned char rngseed[32 + 33 + 33 + 10];
    secp256k1_rfc6979_hmac_sha256 rng;
    secp256k1_scalar acc;
    int overflow;
    int ret;
    size_t i;
    size_t j;
    int b;
    size_t npub;
    VERIFY_CHECK(len <= 10);
    memcpy(rngseed, nonce, 32);
    secp256k1_rangeproof_serialize_point(rngseed + 32, commit);
    secp256k1_rangeproof_serialize_point(rngseed + 32 + 33, genp);
    memcpy(rngseed + 33 + 33 + 32, proof, len);
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, rngseed, 32 + 33 + 33 + len);
    secp256k1_scalar_clear(&acc);
    npub = 0;
    ret = 1;
    for (i = 0; i < rings; i++) {
        if (i < rings - 1) {
            secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
            do {
                secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
                secp256k1_scalar_set_b32(&sec[i], tmp, &overflow);
            } while (overflow || secp256k1_scalar_is_zero(&sec[i]));
            secp256k1_scalar_add(&acc, &acc, &sec[i]);
        } else {
            secp256k1_scalar_negate(&acc, &acc);
            sec[i] = acc;
        }
        for (j = 0; j < rsizes[i]; j++) {
            secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
            if (message) {
                for (b = 0; b < 32; b++) {
                    tmp[b] ^= message[(i * 4 + j) * 32 + b];
                    message[(i * 4 + j) * 32 + b] = tmp[b];
                }
            }
            secp256k1_scalar_set_b32(&s[npub], tmp, &overflow);
            ret &= !(overflow || secp256k1_scalar_is_zero(&s[npub]));
            npub++;
        }
    }
    secp256k1_rfc6979_hmac_sha256_finalize(&rng);
    secp256k1_scalar_clear(&acc);
    memset(tmp, 0, 32);
    return ret;
}